

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

int proto_eq(MIR_item_t pi1,MIR_item_t pi2,void *arg)

{
  uint32_t uVar1;
  MIR_proto_t pMVar2;
  VARR_MIR_var_t *pVVar3;
  node_t_conflict pnVar4;
  gen_ctx_conflict *pgVar5;
  VARR_MIR_type_t *pVVar6;
  int iVar7;
  uint uVar8;
  MIR_type_t MVar9;
  MIR_type_t MVar10;
  ulong extraout_RAX;
  ulong uVar11;
  MIR_type_t *pMVar12;
  mir_size_t mVar13;
  int *piVar14;
  c2m_ctx_t pcVar15;
  MIR_var_t *pMVar16;
  char *suffix;
  MIR_type_t promoted_type;
  MIR_item_t pMVar17;
  c2m_ctx_t pcVar18;
  long lVar19;
  node_t_conflict pnVar20;
  ulong uVar21;
  char *pcVar22;
  size_t sVar23;
  type *arg_type;
  int *piVar24;
  target_arg_info_t tStack_88;
  gen_ctx_conflict *pgStack_80;
  MIR_type_t aMStack_78 [2];
  c2m_ctx_t pcStack_70;
  bool local_31;
  
  pcVar18 = (c2m_ctx_t)(pi1->u).proto;
  pMVar2 = (pi2->u).proto;
  uVar1 = *(uint32_t *)&pcVar18->options;
  if ((uVar1 != pMVar2->nres) || (*(char *)(pcVar18->env[0].__jmpbuf + 1) != pMVar2->vararg_p)) {
    return 0;
  }
  pVVar3 = (VARR_MIR_var_t *)pcVar18->env[0].__jmpbuf[2];
  if (pVVar3 == (VARR_MIR_var_t *)0x0) {
    proto_eq_cold_2();
  }
  else {
    pi2 = (MIR_item_t)pMVar2->args;
    if (pi2 != (MIR_item_t)0x0) {
      pnVar4 = (node_t_conflict)pVVar3->els_num;
      if (pnVar4 != (node_t_conflict)pi2->data) {
        return 0;
      }
      if (uVar1 != 0) {
        lVar19 = 0;
        do {
          if (((MIR_type_t *)pcVar18->env[0].__jmpbuf[0])[lVar19] != pMVar2->res_types[lVar19]) {
            return 0;
          }
          lVar19 = lVar19 + 1;
        } while (uVar1 != (uint32_t)lVar19);
      }
      local_31 = pnVar4 == (node_t_conflict)0x0;
      if (!local_31) {
        pMVar16 = pVVar3->varr;
        pMVar17 = (pi2->item_link).prev;
        MVar10 = pMVar16->type;
        if (MVar10 == *(MIR_type_t *)&pMVar17->data) {
          pnVar20 = (node_t_conflict)0x1;
          lVar19 = 0x18;
          do {
            iVar7 = strcmp(*(char **)((long)pMVar16 + lVar19 + -0x10),
                           *(char **)((long)pMVar17 + lVar19 + -0x10));
            if ((iVar7 != 0) ||
               (((0xfffffff9 < MVar10 - MIR_T_UNDEF &&
                 (*(long *)((long)pMVar16 + lVar19 + -8) != *(long *)((long)pMVar17 + lVar19 + -8)))
                || (local_31 = pnVar4 <= pnVar20, pnVar20 == pnVar4)))) break;
            MVar10 = *(MIR_type_t *)((long)&pMVar16->type + lVar19);
            pnVar20 = (node_t_conflict)((long)&pnVar20->code + 1);
            pMVar12 = (MIR_type_t *)((long)&pMVar17->data + lVar19);
            lVar19 = lVar19 + 0x18;
          } while (MVar10 == *pMVar12);
        }
      }
      return (uint)local_31;
    }
  }
  proto_eq_cold_1();
  pgVar5 = pcVar18->gen_ctx;
  pVVar3 = (pgVar5->proto_info).arg_vars;
  pgStack_80 = pgVar5;
  if ((pVVar3 == (VARR_MIR_var_t *)0x0) || (pVVar3->varr == (MIR_var_t *)0x0)) {
LAB_0019ca19:
    collect_args_and_func_types_cold_6();
LAB_0019ca1e:
    collect_args_and_func_types_cold_5();
  }
  else {
    piVar24 = *(int **)&((pi2->item_link).prev)->item_type;
    pVVar3->els_num = 0;
    pVVar6 = (pgVar5->proto_info).ret_types;
    if ((pVVar6 == (VARR_MIR_type_t *)0x0) || (pVVar6->varr == (MIR_type_t *)0x0))
    goto LAB_0019ca1e;
    pVVar6->els_num = 0;
    (pgVar5->proto_info).res_ref_p = 0;
    tStack_88.n_iregs = 0;
    tStack_88.n_fregs = 0;
    set_type_layout(pcVar18,(type *)pi2->module);
    pi2 = (MIR_item_t)pi2->module;
    pVVar6 = (pgVar5->proto_info).ret_types;
    pVVar3 = (pgVar5->proto_info).arg_vars;
    pcVar15 = pcVar18;
    pcStack_70 = pcVar18;
    if ((*(type_mode *)&(pi2->item_link).next == TM_BASIC) &&
       (uVar11 = extraout_RAX, ((anon_union_8_5_3fbb1736_for_u *)&pi2->addr)->basic_type == TP_VOID)
       ) {
LAB_0019c865:
      if ((piVar24 != (int *)0x0) &&
         (((*piVar24 != 0x7b ||
           (uVar11 = *(ulong *)(*(long *)(piVar24 + 2) + 0x18), *(int *)(uVar11 + 0x18) != 1)) ||
          (*(int *)(uVar11 + 0x30) != 1)))) {
        do {
          if (*piVar24 == 0x7b) {
            arg_type = *(type **)(*(long *)(piVar24 + 2) + 0x18);
            pcVar22 = "p";
          }
          else {
            piVar14 = *(int **)(piVar24 + 8);
            if (piVar14 != (int *)0x0) {
              piVar14 = *(int **)(piVar14 + 6);
            }
            if (((*piVar24 != 0x55) || (piVar14 == (int *)0x0)) || (*piVar14 != 0x5d))
            goto LAB_0019c9f5;
            arg_type = *(type **)(*(long *)(piVar24 + 2) + 0x40);
            pcVar22 = get_param_name(pcVar15,arg_type,*(char **)(*(long *)(piVar14 + 8) + 0x20));
          }
          pVVar3 = (pgStack_80->proto_info).arg_vars;
          iVar7 = process_aggregate_arg(pcVar15,arg_type,&tStack_88,aMStack_78);
          if ((arg_type->mode & ~TM_BASIC) == TM_STRUCT) {
            MVar10 = get_blk_type(iVar7,aMStack_78);
            pcVar15 = (c2m_ctx_t)raw_type_size(pcVar15,arg_type);
            uVar11 = (ulong)arg_type->align;
            if (uVar11 != 0) {
              uVar21 = (long)pcVar15->env[0].__jmpbuf + (uVar11 - 0x11);
              pcVar15 = (c2m_ctx_t)(uVar21 - uVar21 % uVar11);
            }
          }
          else {
            MVar10 = get_mir_type(pcVar15,arg_type);
            if ((MVar10 & 0x1e) == MIR_T_F) {
              tStack_88.n_fregs = tStack_88.n_fregs + 1;
            }
            else if (MVar10 != MIR_T_LD) {
              tStack_88.n_iregs = tStack_88.n_iregs + 1;
            }
          }
          if (pVVar3->varr == (MIR_var_t *)0x0) {
            collect_args_and_func_types_cold_4();
LAB_0019c9f5:
            __assert_fail("p->code == N_SPEC_DECL && declarator != NULL && declarator->code == N_DECL"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x2c94,"void collect_args_and_func_types(c2m_ctx_t, struct func_type *)")
            ;
          }
          uVar11 = pVVar3->els_num + 1;
          if (pVVar3->size < uVar11) {
            sVar23 = (uVar11 >> 1) + uVar11;
            pMVar16 = (MIR_var_t *)realloc(pVVar3->varr,sVar23 * 0x18);
            pVVar3->varr = pMVar16;
            pVVar3->size = sVar23;
          }
          sVar23 = pVVar3->els_num;
          pMVar16 = pVVar3->varr;
          uVar11 = sVar23 * 3;
          pVVar3->els_num = sVar23 + 1;
          pMVar16[sVar23].type = MVar10;
          pMVar16[sVar23].name = pcVar22;
          pMVar16[sVar23].size = (size_t)pcVar15;
          piVar24 = *(int **)(piVar24 + 6);
          pcVar15 = pcStack_70;
        } while (piVar24 != (int *)0x0);
      }
      return (int)uVar11;
    }
    uVar8 = process_ret_type(pcVar18,(type *)pi2,aMStack_78);
    uVar11 = (ulong)uVar8;
    if (uVar8 != 0) {
      if (0 < (int)uVar8) {
        uVar21 = 0;
        do {
          pi2 = (MIR_item_t)0x5;
          MVar10 = aMStack_78[uVar21];
          MVar9 = MVar10 & ~MIR_T_I16;
          if (MVar9 == MIR_T_U8) {
            MVar10 = MIR_T_U32;
          }
          if (MVar9 == MIR_T_I8) {
            MVar10 = MIR_T_I32;
          }
          pcVar18 = (c2m_ctx_t)pVVar6->varr;
          if (pcVar18 == (c2m_ctx_t)0x0) {
            collect_args_and_func_types_cold_1();
            goto LAB_0019ca19;
          }
          uVar11 = pVVar6->els_num + 1;
          if (pVVar6->size < uVar11) {
            sVar23 = (uVar11 >> 1) + uVar11;
            pMVar12 = (MIR_type_t *)realloc(pcVar18,sVar23 * 4);
            pVVar6->varr = pMVar12;
            pVVar6->size = sVar23;
            pcVar15 = pcStack_70;
          }
          uVar11 = pVVar6->els_num;
          pVVar6->els_num = uVar11 + 1;
          pVVar6->varr[uVar11] = MVar10;
          uVar21 = uVar21 + 1;
        } while (uVar8 != uVar21);
      }
      goto LAB_0019c865;
    }
    if (((ulong)(pi2->item_link).next & 0xfffffffe) != 4) {
      MVar10 = get_mir_type(pcVar18,(type *)pi2);
      pcVar18 = (c2m_ctx_t)pVVar6->varr;
      if (pcVar18 != (c2m_ctx_t)0x0) {
        uVar11 = pVVar6->els_num + 1;
        if (pVVar6->size < uVar11) {
          sVar23 = (uVar11 >> 1) + uVar11;
          pMVar12 = (MIR_type_t *)realloc(pcVar18,sVar23 * 4);
          pVVar6->varr = pMVar12;
          pVVar6->size = sVar23;
        }
        uVar11 = pVVar6->els_num;
        pVVar6->els_num = uVar11 + 1;
        pVVar6->varr[uVar11] = MVar10;
        goto LAB_0019c865;
      }
      goto LAB_0019ca28;
    }
    pMVar17 = pi2;
    mVar13 = raw_type_size(pcVar18,(type *)pi2);
    uVar11 = (ulong)(int)pi2->item_type;
    if (uVar11 != 0) {
      uVar21 = (mVar13 - 1) + uVar11;
      mVar13 = uVar21 - uVar21 % uVar11;
    }
    pcVar18 = (c2m_ctx_t)pVVar3->varr;
    pi2 = pMVar17;
    if (pcVar18 != (c2m_ctx_t)0x0) {
      uVar11 = pVVar3->els_num + 1;
      if (pVVar3->size < uVar11) {
        sVar23 = (uVar11 >> 1) + uVar11;
        pMVar16 = (MIR_var_t *)realloc(pcVar18,sVar23 * 0x18);
        pVVar3->varr = pMVar16;
        pVVar3->size = sVar23;
      }
      sVar23 = pVVar3->els_num;
      pMVar16 = pVVar3->varr;
      uVar11 = sVar23 * 3;
      pVVar3->els_num = sVar23 + 1;
      pMVar16[sVar23].type = MIR_T_RBLK;
      pMVar16[sVar23].name = "Ret_Addr";
      pMVar16[sVar23].size = mVar13;
      tStack_88.n_iregs = 1;
      goto LAB_0019c865;
    }
  }
  collect_args_and_func_types_cold_3();
LAB_0019ca28:
  collect_args_and_func_types_cold_2();
  if (pcVar18 != (c2m_ctx_t)0x0) {
    return (int)pcVar18->env[0].__jmpbuf[0];
  }
  VARR_MIR_var_taddr_cold_1();
  if (pcVar18 != (c2m_ctx_t)0x0) {
    return (int)pcVar18->ctx;
  }
  VARR_MIR_var_tlength_cold_1();
  MVar10 = MIR_T_I64;
  if (((ulong)(pi2->item_link).next & 0xfffffffe) != 4) {
    MVar10 = get_mir_type(pcVar18,(type *)pi2);
  }
  MVar9 = MIR_T_U32;
  if ((MVar10 & 0x1d) != MIR_T_U8) {
    MVar9 = MVar10;
  }
  promoted_type = MIR_T_I32;
  if ((MVar10 & 0x1d) != MIR_T_I8) {
    promoted_type = MVar9;
  }
  pcVar22 = get_reg_var_name(pcVar18,promoted_type,suffix,0);
  return (int)pcVar22;
}

Assistant:

static int proto_eq (MIR_item_t pi1, MIR_item_t pi2, void *arg MIR_UNUSED) {
  MIR_proto_t p1 = pi1->u.proto, p2 = pi2->u.proto;

  if (p1->nres != p2->nres || p1->vararg_p != p2->vararg_p
      || VARR_LENGTH (MIR_var_t, p1->args) != VARR_LENGTH (MIR_var_t, p2->args))
    return FALSE;
  for (uint32_t i = 0; i < p1->nres; i++)
    if (p1->res_types[i] != p2->res_types[i]) return FALSE;

  MIR_var_t *args1 = VARR_ADDR (MIR_var_t, p1->args), *args2 = VARR_ADDR (MIR_var_t, p2->args);

  for (size_t i = 0; i < VARR_LENGTH (MIR_var_t, p1->args); i++)
    if (args1[i].type != args2[i].type || strcmp (args1[i].name, args2[i].name) != 0
        || (MIR_all_blk_type_p (args1[i].type) && args1[i].size != args2[i].size))
      return FALSE;
  return TRUE;
}